

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O0

vector<Reading,_std::allocator<Reading>_> *
get_readings_from_file
          (vector<Reading,_std::allocator<Reading>_> *__return_storage_ptr__,string *file_name)

{
  byte bVar1;
  bool bVar2;
  runtime_error *this;
  istream *piVar3;
  byte local_2ba;
  undefined1 local_290 [8];
  Reading r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_220;
  ifstream ifs;
  string *file_name_local;
  vector<Reading,_std::allocator<Reading>_> *readings;
  
  std::ifstream::ifstream(&local_220,file_name,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    r._22_1_ = 0;
    std::vector<Reading,_std::allocator<Reading>_>::vector(__return_storage_ptr__);
    while( true ) {
      piVar3 = operator>>((istream *)&local_220,(Reading *)local_290);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      local_2ba = 0;
      if (bVar2) {
        local_2ba = std::ios::eof();
        local_2ba = local_2ba ^ 0xff;
      }
      if ((local_2ba & 1) == 0) break;
      if (r.temp._0_1_ == 'f') {
        r._0_8_ = fahr_to_celc((double)r._0_8_);
      }
      std::vector<Reading,_std::allocator<Reading>_>::push_back
                (__return_storage_ptr__,(value_type *)local_290);
      r.hour = 0xffe00000;
      r._4_4_ = 0x41efffff;
      local_290._0_4_ = 0x19;
      r.temp._0_1_ = 'k';
    }
    r._22_1_ = 1;
    std::ifstream::~ifstream(&local_220);
    return __return_storage_ptr__;
  }
  r._23_1_ = 1;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_270,"\'",file_name);
  std::operator+(&local_250,&local_270,"\' could not be opened for reading.");
  std::runtime_error::runtime_error(this,(string *)&local_250);
  r._23_1_ = 0;
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<Reading> get_readings_from_file(const std::string& file_name)
{
	static const auto invalid_temp{ UINT32_MAX };
	static const auto invalid_hour{ 25 };
	static const auto invalid_temp_unit{ 'k' };
	std::ifstream ifs{ file_name };
	if (!ifs)
	{
		throw std::runtime_error("'" + file_name + "' could not be opened for reading.");
	}
	std::vector<Reading> readings;
	Reading r;
	while (ifs >> r && !ifs.eof())
	{
		if (r.temp_unit == 'f')
		{
			r.temp = fahr_to_celc(r.temp);
		}
		readings.push_back(r);
		r.temp = invalid_temp;
		r.hour = invalid_hour;
		r.temp_unit = invalid_temp_unit;
	}
	return readings;
}